

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zCrcOpt.c
# Opt level: O2

UInt32 CrcUpdateT8(UInt32 v,void *data,size_t size,UInt32 *table)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  
  uVar3 = (ulong)v;
  puVar5 = (uint *)data;
  for (; (size != 0 && (((ulong)data & 7) != 0)); data = (void *)((long)data + 1)) {
    uVar3 = (ulong)((uint)(uVar3 >> 8) ^ table[(byte)((byte)*puVar5 ^ (byte)uVar3)]);
    puVar5 = (uint *)((long)puVar5 + 1);
    size = size - 1;
  }
  for (; 7 < size; size = size - 8) {
    uVar2 = (uint)uVar3 ^ *puVar5;
    uVar1 = puVar5[1];
    uVar3 = (ulong)(*(uint *)((long)table + (ulong)(uVar2 >> 6 & 0x3fc) + 0x1800) ^
                    table[(ulong)(uVar2 & 0xff) + 0x700] ^
                    *(uint *)((long)table + (ulong)(uVar2 >> 0xe & 0x3fc) + 0x1400) ^
                    *(uint *)((long)table + (ulong)(uVar2 >> 0x16 & 0xfffffffc) + 0x1000) ^
                    table[(ulong)(uVar1 & 0xff) + 0x300] ^
                    *(uint *)((long)table + (ulong)(uVar1 >> 6 & 0x3fc) + 0x800) ^
                    *(uint *)((long)table + (ulong)(uVar1 >> 0xe & 0x3fc) + 0x400) ^
                   table[uVar1 >> 0x18]);
    puVar5 = puVar5 + 2;
  }
  for (uVar4 = 0; size != uVar4; uVar4 = uVar4 + 1) {
    uVar3 = (ulong)((UInt32)uVar3 >> 8 ^
                   table[(byte)(*(byte *)((long)puVar5 + uVar4) ^ (byte)uVar3)]);
  }
  return (UInt32)uVar3;
}

Assistant:

UInt32 MY_FAST_CALL CrcUpdateT8(UInt32 v, const void *data, size_t size, const UInt32 *table)
{
  const Byte *p = (const Byte *)data;
  for (; size > 0 && ((unsigned)(ptrdiff_t)p & 7) != 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  for (; size >= 8; size -= 8, p += 8)
  {
    UInt32 d;
    v ^= *(const UInt32 *)p;
    v =
          table[0x700 + ((v      ) & 0xFF)]
        ^ table[0x600 + ((v >>  8) & 0xFF)]
        ^ table[0x500 + ((v >> 16) & 0xFF)]
        ^ table[0x400 + ((v >> 24))];
    d = *((const UInt32 *)p + 1);
    v ^=
          table[0x300 + ((d      ) & 0xFF)]
        ^ table[0x200 + ((d >>  8) & 0xFF)]
        ^ table[0x100 + ((d >> 16) & 0xFF)]
        ^ table[0x000 + ((d >> 24))];
  }
  for (; size > 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  return v;
}